

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

stref idx2::GetExtension(stref *Path)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  stref sVar4;
  
  lVar1 = (long)Path->Size + -1;
  lVar2 = lVar1;
  if ((long)Path->Size != 0) {
    do {
      if ((Path->field_0).Ptr[lVar2] == '.') goto LAB_0019d00f;
      bVar3 = lVar2 != 0;
      lVar2 = lVar2 + -1;
    } while (bVar3);
    lVar2 = -1;
  }
LAB_0019d00f:
  if (lVar2 == -1) {
    sVar4 = (stref)ZEXT816(0);
  }
  else {
    sVar4 = SubString(Path,(int)lVar2 + 1,(int)lVar1 - (int)lVar2);
  }
  return sVar4;
}

Assistant:

stref
GetExtension(const stref& Path)
{
  cstr LastDot = FindLast(RevBegin(Path), RevEnd(Path), '.');
  if (LastDot == RevEnd(Path))
    return stref();

  return SubString(Path, int(LastDot + 1 - Begin(Path)), int(End(Path) - 1 - LastDot));
}